

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O3

bool __thiscall
Assimp::PLYImporter::CanRead(PLYImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  string extension;
  string local_40;
  
  BaseImporter::GetExtension(&local_40,pFile);
  iVar2 = std::__cxx11::string::compare((char *)&local_40);
  bVar1 = true;
  if (iVar2 != 0) {
    if (local_40._M_string_length == 0 || checkSig) {
      if (pIOHandler != (IOSystem *)0x0) {
        bVar1 = BaseImporter::SearchFileHeaderForToken
                          (pIOHandler,pFile,CanRead::tokens,1,200,false,false);
      }
    }
    else {
      bVar1 = false;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool PLYImporter::CanRead(const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const {
    const std::string extension = GetExtension(pFile);

    if ( extension == "ply" ) {
        return true;
    } else if (!extension.length() || checkSig) {
        if ( !pIOHandler ) {
            return true;
        }
        static const char* tokens[] = { "ply" };
        return SearchFileHeaderForToken(pIOHandler, pFile, tokens, 1);
    }

    return false;
}